

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterSet.cpp
# Opt level: O3

CharacterSet ZXing::CharacterSetFromString(string_view name)

{
  long *plVar1;
  bool bVar2;
  CharacterSet CVar3;
  long lVar4;
  char *in_RCX;
  long lVar5;
  ulong uVar6;
  undefined **ppuVar7;
  string_view sv;
  long *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_60;
  undefined8 local_58;
  string local_50;
  
  sv._M_str = in_RCX;
  sv._M_len = (size_t)name._M_str;
  NormalizeName_abi_cxx11_(&local_50,(ZXing *)name._M_len,sv);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_d0 = (long *)&local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_90,local_88 + (long)local_90);
  lVar4 = local_c8;
  local_60 = CONCAT71(uStack_bf,local_c0);
  local_70 = local_d0;
  plVar1 = (long *)&local_c0;
  if (local_d0 == (long *)&local_c0) {
    local_58 = local_b8;
    local_70 = &local_60;
    plVar1 = local_d0;
  }
  local_d0 = plVar1;
  local_c0 = 0;
  local_c8 = 0;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_70,(undefined1 *)(lVar4 + (long)local_70));
  uVar6 = 0xb;
  lVar4 = 0;
  do {
    lVar5 = lVar4;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)local_b0,*(CharacterSetName **)((long)&NAME_TO_CHARSET + lVar5));
    if (bVar2) {
      ppuVar7 = (undefined **)((long)&NAME_TO_CHARSET + lVar5);
      goto LAB_00132627;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)local_b0,*(CharacterSetName **)((long)&DAT_001f8f58 + lVar5));
    if (bVar2) {
      ppuVar7 = (undefined **)((long)&DAT_001f8f58 + lVar5);
      goto LAB_00132627;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)local_b0,*(CharacterSetName **)((long)&DAT_001f8f70 + lVar5));
    if (bVar2) {
      ppuVar7 = (undefined **)((long)&DAT_001f8f70 + lVar5);
      goto LAB_00132627;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)local_b0,*(CharacterSetName **)((long)&DAT_001f8f88 + lVar5));
    if (bVar2) {
      ppuVar7 = (undefined **)((long)&DAT_001f8f88 + lVar5);
      goto LAB_00132627;
    }
    uVar6 = uVar6 - 1;
    lVar4 = lVar5 + 0x60;
  } while (1 < uVar6);
  lVar4 = (0x3f0 - (lVar5 + 0x60) >> 3) * -0x5555555555555555;
  ppuVar7 = (undefined **)((long)&DAT_001f8fa0 + lVar5);
  if (lVar4 == 1) {
LAB_0013260b:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)local_b0,(CharacterSetName *)*ppuVar7);
    if (bVar2) goto LAB_00132627;
  }
  else {
    if (lVar4 == 3) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)local_b0,*(CharacterSetName **)((long)&DAT_001f8fa0 + lVar5));
      if (bVar2) goto LAB_00132627;
      ppuVar7 = (undefined **)((long)&DAT_001f8fb8 + lVar5);
LAB_001325f2:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)local_b0,(CharacterSetName *)*ppuVar7);
      if (bVar2) goto LAB_00132627;
      ppuVar7 = ppuVar7 + 3;
      goto LAB_0013260b;
    }
    if (lVar4 == 2) goto LAB_001325f2;
  }
  ppuVar7 = &PTR_typeinfo_001f9330;
LAB_00132627:
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_d0 != (long *)&local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (ppuVar7 == &PTR_typeinfo_001f9330) {
    CVar3 = Unknown;
  }
  else {
    CVar3 = *(CharacterSet *)(ppuVar7 + 2);
  }
  return CVar3;
}

Assistant:

CharacterSet CharacterSetFromString(std::string_view name)
{
	auto i = FindIf(NAME_TO_CHARSET, [str = NormalizeName(name)](auto& v) { return NormalizeName(v.name) == str; });
	return i == std::end(NAME_TO_CHARSET) ? CharacterSet::Unknown : i->cs;
}